

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::parseClassMember(Parser *this)

{
  int iVar1;
  pointer pTVar2;
  bool bVar3;
  Node *pNVar4;
  
  iVar1 = this->pos;
  pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2[iVar1].type == TK_BASE) {
    this->tok = pTVar2 + iVar1;
    this->pos = iVar1 + 1;
    pNVar4 = createBaseNode(this,pTVar2 + iVar1);
    return pNVar4;
  }
  iVar1 = this->pos;
  if (pTVar2[iVar1].type == TK_CONSTRUCTOR) {
    this->tok = pTVar2 + iVar1;
    this->pos = iVar1 + 1;
    pNVar4 = createAccessConstructorNode(this,pTVar2 + iVar1);
    return pNVar4;
  }
  bVar3 = expect(this,TK_IDENTIFIER);
  if (bVar3) {
    pNVar4 = createIdentifierNode(this,this->tok);
    return pNVar4;
  }
  return (Node *)0x0;
}

Assistant:

Node * parseClassMember()
  {
    if (accept(TK_BASE))
      return createBaseNode(*tok);

    if (accept(TK_CONSTRUCTOR))
      return createAccessConstructorNode(*tok);

    if (expect(TK_IDENTIFIER))
      return createIdentifierNode(*tok);

    return nullptr;
  }